

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::Tex2DShader::shadeFragments
          (Tex2DShader *this,FragmentPacket *packets,int numPackets,FragmentShadingContext *context)

{
  ulong uVar1;
  ulong uVar2;
  Vec4 *output;
  int fragNdx;
  long lVar3;
  Vec2 texCoords [4];
  Vec4 coord;
  Vec4 colors [4];
  Vec2 local_a8 [4];
  undefined8 local_88 [2];
  Vec4 local_78 [4];
  
  local_a8[2].m_data[0] = 0.0;
  local_a8[2].m_data[1] = 0.0;
  local_a8[3].m_data[0] = 0.0;
  local_a8[3].m_data[1] = 0.0;
  local_a8[0].m_data[0] = 0.0;
  local_a8[0].m_data[1] = 0.0;
  local_a8[1].m_data[0] = 0.0;
  local_a8[1].m_data[1] = 0.0;
  lVar3 = 0;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)local_78[0].m_data + lVar3));
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  uVar2 = 0;
  uVar1 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar1 = uVar2;
  }
  for (; uVar2 != uVar1; uVar2 = uVar2 + 1) {
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      rr::readTriangleVarying<float>((rr *)local_88,packets + uVar2,context,0,(int)lVar3);
      *(undefined8 *)local_a8[lVar3].m_data = local_88[0];
    }
    output = local_78;
    sglr::rc::Texture2D::sample4
              ((((this->super_ShaderProgram).m_uniforms.
                 super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
                 super__Vector_impl_data._M_start)->sampler).tex2D,output,local_a8,0.0);
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      rr::writeFragmentOutput<tcu::Vector<float,4>>(context,(int)uVar2,(int)lVar3,0,output);
      output = output + 1;
    }
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		tcu::Vec2 texCoords[4];
		tcu::Vec4 colors[4];

		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			// setup tex coords
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			{
				const tcu::Vec4	coord = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
				texCoords[fragNdx] = tcu::Vec2(coord.x(), coord.y());
			}

			// Sample
			m_uniforms[0].sampler.tex2D->sample4(colors, texCoords);

			// Write out
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, colors[fragNdx]);
		}
	}